

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cc
# Opt level: O2

int SHA256_Final(uchar *md,SHA256_CTX *c)

{
  bool bVar1;
  
  bVar1 = c->md_len < 0x21;
  if (bVar1) {
    BCM_sha256_final(md,(SHA256_CTX *)c);
  }
  return (uint)bVar1;
}

Assistant:

int SHA256_Final(uint8_t out[SHA256_DIGEST_LENGTH], SHA256_CTX *sha) {
  // TODO(bbe): This overflow check one of the few places a low-level hash
  // 'final' function can fail. SHA-512 does not have a corresponding check.
  // The BCM function is infallible and will abort if this is done incorrectly.
  // we should verify nothing crashes with this removed and eliminate the 0
  // return.
  if (sha->md_len > SHA256_DIGEST_LENGTH) {
    return 0;
  }
  BCM_sha256_final(out, sha);
  return 1;
}